

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_functions.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DefaultFunctionGenerator::CreateDefaultEntry
          (DefaultFunctionGenerator *this,ClientContext *context,string *entry_name)

{
  Catalog *args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *args_1;
  DefaultMacro *pDVar1;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> this_00;
  bool bVar2;
  CreateMacroInfo *args_2;
  string *in_RCX;
  pointer *__ptr;
  DefaultMacro *macro;
  array_ptr<const_duckdb::DefaultMacro,_true> macros;
  _Head_base<0UL,_duckdb::CreateFunctionInfo_*,_false> local_88;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_80;
  undefined1 local_78 [8];
  string name;
  string schema;
  
  StringUtil::Lower((string *)&schema,
                    (string *)
                    ((context->db).internal.
                     super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 2));
  StringUtil::Lower((string *)&name,in_RCX);
  for (macro = (DefaultMacro *)&internal_macros; local_80._M_head_impl = (CatalogEntry *)this,
      macro->name != (char *)0x0; macro = macro + 1) {
    bVar2 = DefaultFunctionMatches(macro,&schema,&name);
    if (bVar2) {
      pDVar1 = macro;
      goto LAB_015ff4db;
    }
  }
  local_88._M_head_impl = (CreateFunctionInfo *)0x0;
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::string::~string((string *)&schema);
  goto LAB_015ff569;
  while (bVar2 = DefaultFunctionMatches(pDVar1 + 1,&schema,&name), pDVar1 = pDVar1 + 1, bVar2) {
LAB_015ff4db:
    if (pDVar1[1].name == (char *)0x0) break;
  }
  macros.count = (idx_t)macro;
  macros.ptr = (DefaultMacro *)local_78;
  CreateInternalMacroInfo(macros);
  local_88._M_head_impl = (CreateFunctionInfo *)local_78;
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::string::~string((string *)&schema);
  this_00._M_head_impl = local_80._M_head_impl;
  if (local_78 != (undefined1  [8])0x0) {
    args = (Catalog *)
           (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    args_1 = (context->db).internal.
             super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    args_2 = (CreateMacroInfo *)
             unique_ptr<duckdb::CreateFunctionInfo,_std::default_delete<duckdb::CreateFunctionInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateFunctionInfo,_std::default_delete<duckdb::CreateFunctionInfo>,_true>
                           *)&local_88);
    make_uniq_base<duckdb::CatalogEntry,duckdb::ScalarMacroCatalogEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::CreateMacroInfo&>
              ((duckdb *)this_00._M_head_impl,args,(SchemaCatalogEntry *)args_1,args_2);
    if (local_88._M_head_impl == (CreateFunctionInfo *)0x0) {
      return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
             this_00._M_head_impl;
    }
    (*((local_88._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>)
           (_Head_base<0UL,_duckdb::CatalogEntry_*,_false>)this_00._M_head_impl;
  }
LAB_015ff569:
  (local_80._M_head_impl)->_vptr_CatalogEntry = 0;
  return ((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         local_80._M_head_impl).
         super_unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>;
}

Assistant:

unique_ptr<CatalogEntry> DefaultFunctionGenerator::CreateDefaultEntry(ClientContext &context,
                                                                      const string &entry_name) {
	auto info = GetDefaultFunction(schema.name, entry_name);
	if (info) {
		return make_uniq_base<CatalogEntry, ScalarMacroCatalogEntry>(catalog, schema, info->Cast<CreateMacroInfo>());
	}
	return nullptr;
}